

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.h
# Opt level: O0

int av1_read_uniform(aom_reader *r,int n)

{
  int iVar1;
  int bits;
  int in_ESI;
  int v;
  int m;
  int l;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  iVar1 = get_unsigned_bits(0);
  iVar1 = (1 << ((byte)iVar1 & 0x1f)) - in_ESI;
  local_4 = aom_read_literal_((aom_reader *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                              in_stack_ffffffffffffffdc);
  if (iVar1 <= local_4) {
    bits = local_4 * 2 - iVar1;
    local_4 = aom_read_literal_((aom_reader *)CONCAT44(iVar1,local_4),bits);
    local_4 = bits + local_4;
  }
  return local_4;
}

Assistant:

static inline int av1_read_uniform(aom_reader *r, int n) {
  const int l = get_unsigned_bits(n);
  const int m = (1 << l) - n;
  const int v = aom_read_literal(r, l - 1, ACCT_STR);
  assert(l != 0);
  if (v < m)
    return v;
  else
    return (v << 1) - m + aom_read_literal(r, 1, ACCT_STR);
}